

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setAccessibleDescription(QWidget *this,QString *description)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  code *local_48;
  undefined8 uStack_40;
  QWidget *local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar2 = (description->d).size;
  if (*(long *)(lVar1 + 0x160) == lVar2) {
    QVar4.m_data = *(storage_type_conflict **)(lVar1 + 0x158);
    QVar4.m_size = *(long *)(lVar1 + 0x160);
    QVar5.m_data = (description->d).ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') goto LAB_0030f17a;
  }
  QString::operator=((QString *)(lVar1 + 0x150),(QString *)description);
  local_48 = QFont::strikeOut;
  uStack_40 = 0xaaaaaaaa0000800d;
  uStack_30 = 0xaaaaaaaaffffffff;
  local_38 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
LAB_0030f17a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setAccessibleDescription(const QString &description)
{
    Q_D(QWidget);
    if (d->accessibleDescription == description)
        return;

    d->accessibleDescription = description;
    QAccessibleEvent event(this, QAccessible::DescriptionChanged);
    QAccessible::updateAccessibility(&event);
}